

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_prime.c
# Opt level: O0

int BN_generate_prime_ex(BIGNUM *ret,int bits,int safe,BIGNUM *add,BIGNUM *rem,BN_GENCB *cb)

{
  BN_CTX *c;
  int unaff_retaddr;
  int unaff_retaddr_00;
  BIGNUM *in_stack_00000008;
  int retval;
  BN_CTX *ctx;
  BN_CTX *in_stack_00000020;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  c = BN_CTX_new();
  if (c == (BN_CTX *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = BN_generate_prime_ex2
                      (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                       (BIGNUM *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (BIGNUM *)ret,(BN_GENCB *)CONCAT44(bits,safe),in_stack_00000020);
    BN_CTX_free(c);
  }
  return iVar1;
}

Assistant:

int BN_generate_prime_ex(BIGNUM *ret, int bits, int safe,
                         const BIGNUM *add, const BIGNUM *rem, BN_GENCB *cb)
{
    BN_CTX *ctx = BN_CTX_new();
    int retval;

    if (ctx == NULL)
        return 0;

    retval = BN_generate_prime_ex2(ret, bits, safe, add, rem, cb, ctx);

    BN_CTX_free(ctx);
    return retval;
}